

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::DefaultForField_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field)

{
  Type TVar1;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  php *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0.0",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_INT32:
  case TYPE_FIXED64:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_ENUM:
  case TYPE_SFIXED32:
  case TYPE_SFIXED64:
  case TYPE_SINT32:
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"false",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\'",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                  ,0xc6,
                  "std::string google::protobuf::compiler::php::DefaultForField(const FieldDescriptor *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultForField(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_ENUM: return "0";
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT: return "0.0";
    case FieldDescriptor::TYPE_BOOL: return "false";
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: return "''";
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: return "null";
    default: assert(false); return "";
  }
}